

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderNaive.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscReaderNaive::GetDeferred
          (SscReaderNaive *this,VariableBase *variable,void *data)

{
  size_t sVar1;
  undefined8 uVar2;
  string *psVar3;
  bool bVar4;
  __type _Var5;
  char *pcVar6;
  uint8_t *puVar7;
  string *in_RDX;
  long in_RSI;
  long in_RDI;
  BlockInfo *b_1;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  DimsArray vMemCount;
  DimsArray vMemStart;
  DimsArray vCount;
  DimsArray vStart;
  BlockInfo *b;
  iterator __end4;
  iterator __begin4;
  mapped_type *__range4;
  string *dataString;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variableString;
  key_type *in_stack_fffffffffffff9e8;
  CoreDims *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  DimsArray *in_stack_fffffffffffffa10;
  long local_558;
  CoreDims local_540;
  CoreDims local_530;
  CoreDims local_520;
  CoreDims local_510;
  reference local_500;
  BlockInfo *local_4f8;
  __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
  local_4f0;
  mapped_type *local_4e8;
  CoreDims local_4e0 [17];
  CoreDims local_3d0 [17];
  CoreDims local_2c0 [17];
  key_type local_1b0 [9];
  allocator<char> local_89;
  string local_88 [32];
  reference local_68;
  BlockInfo *local_60;
  __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
  local_58;
  mapped_type *local_50;
  string *local_48;
  long local_40;
  string *local_38;
  long local_30;
  
  local_38 = in_RDX;
  if (*(int *)(in_RSI + 0x28) == 0xe) {
    if (in_RSI == 0) {
      local_558 = 0;
    }
    else {
      local_558 = __dynamic_cast(in_RSI,&VariableBase::typeinfo,
                                 &Variable<std::__cxx11::string>::typeinfo,0);
    }
    local_40 = local_558;
    local_48 = local_38;
    local_50 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>_>
                             *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    local_58._M_current =
         (BlockInfo *)
         std::
         vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
         ::begin((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                  *)in_stack_fffffffffffff9e8);
    local_60 = (BlockInfo *)
               std::
               vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
               ::end((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                      *)in_stack_fffffffffffff9e8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_fffffffffffff9f0,
                              (__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_fffffffffffff9e8), bVar4) {
      local_68 = __gnu_cxx::
                 __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                 ::operator*(&local_58);
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffa10,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
      if (_Var5) {
        Buffer::data((Buffer *)(in_RDI + 0x70),0);
        Buffer::data((Buffer *)(in_RDI + 0x70),0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<unsigned_char*,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa10,
                   (uchar *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                   (uchar *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8))
        ;
        std::__cxx11::string::operator=(local_48,local_88);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator(&local_89);
        std::__cxx11::string::operator=((string *)(local_40 + 0x268),local_48);
        std::__cxx11::string::operator=((string *)(local_40 + 0x228),local_48);
        std::__cxx11::string::operator=((string *)(local_40 + 0x248),local_48);
      }
      __gnu_cxx::
      __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
      ::operator++(&local_58);
    }
  }
  else {
    local_30 = in_RSI;
    helper::DimsArray::DimsArray
              (in_stack_fffffffffffffa10,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    helper::DimsArray::DimsArray
              (in_stack_fffffffffffffa10,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    helper::DimsArray::DimsArray
              (in_stack_fffffffffffffa10,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    helper::DimsArray::DimsArray
              (in_stack_fffffffffffffa10,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    if (*(int *)(*(long *)(in_RDI + 0xc0) + 0x58) != 0) {
      helper::CoreDims::begin((CoreDims *)local_1b0);
      helper::CoreDims::end((CoreDims *)local_1b0);
      std::reverse<unsigned_long*>
                ((unsigned_long *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      helper::CoreDims::begin(local_2c0);
      helper::CoreDims::end(local_2c0);
      std::reverse<unsigned_long*>
                ((unsigned_long *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      helper::CoreDims::begin(local_3d0);
      helper::CoreDims::end(local_3d0);
      std::reverse<unsigned_long*>
                ((unsigned_long *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      helper::CoreDims::begin(local_4e0);
      helper::CoreDims::end(local_4e0);
      std::reverse<unsigned_long*>
                ((unsigned_long *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    }
    local_4e8 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>_>
                              *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    local_4f0._M_current =
         (BlockInfo *)
         std::
         vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
         ::begin((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                  *)in_stack_fffffffffffff9e8);
    local_4f8 = (BlockInfo *)
                std::
                vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                ::end((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                       *)in_stack_fffffffffffff9e8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_fffffffffffff9f0,
                              (__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_fffffffffffff9e8), bVar4) {
      local_500 = __gnu_cxx::
                  __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                  ::operator*(&local_4f0);
      psVar3 = local_38;
      if ((local_500->shapeId == GlobalArray) || (local_500->shapeId == LocalArray)) {
        pcVar6 = Buffer::data<char>((Buffer *)(in_RDI + 0x70),0);
        sVar1 = local_500->bufferStart;
        helper::CoreDims::CoreDims
                  (in_stack_fffffffffffff9f0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff9e8);
        helper::CoreDims::CoreDims
                  (in_stack_fffffffffffff9f0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff9e8);
        psVar3 = local_38;
        uVar2 = *(undefined8 *)(local_30 + 0x30);
        helper::CoreDims::CoreDims
                  (in_stack_fffffffffffff9f0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff9e8);
        helper::CoreDims::CoreDims
                  (in_stack_fffffffffffff9f0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff9e8);
        in_stack_fffffffffffff9e8 = local_1b0;
        in_stack_fffffffffffff9f0 = local_2c0;
        adios2::helper::NdCopy
                  (pcVar6 + sVar1,&local_510,&local_520,true,true,(char *)psVar3,
                   (CoreDims *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9f0,true,true,
                   (int)uVar2,&local_530,&local_540,local_3d0,local_4e0,false,Host,false);
      }
      else if ((local_500->shapeId == GlobalValue) || (local_500->shapeId == LocalValue)) {
        puVar7 = Buffer::data((Buffer *)(in_RDI + 0x70),0);
        memcpy(psVar3,puVar7 + local_500->bufferStart,local_500->bufferCount);
      }
      __gnu_cxx::
      __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
      ::operator++(&local_4f0);
    }
  }
  return;
}

Assistant:

void SscReaderNaive::GetDeferred(VariableBase &variable, void *data)
{

    if (variable.m_Type == DataType::String)
    {
        auto *variableString = dynamic_cast<Variable<std::string> *>(&variable);
        auto *dataString = reinterpret_cast<std::string *>(data);
        for (const auto &b : m_BlockMap[variable.m_Name])
        {
            if (b.name == variable.m_Name)
            {
                *dataString = std::string(m_Buffer.data() + b.bufferStart,
                                          m_Buffer.data() + b.bufferStart + b.bufferCount);
                variableString->m_Value = *dataString;
                variableString->m_Min = *dataString;
                variableString->m_Max = *dataString;
            }
        }
        return;
    }

    helper::DimsArray vStart(variable.m_Start);
    helper::DimsArray vCount(variable.m_Count);
    helper::DimsArray vMemStart(variable.m_MemoryStart);
    helper::DimsArray vMemCount(variable.m_MemoryCount);

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    for (const auto &b : m_BlockMap[variable.m_Name])
    {
        if (b.shapeId == ShapeID::GlobalArray || b.shapeId == ShapeID::LocalArray)
        {
            helper::NdCopy(m_Buffer.data<char>() + b.bufferStart, helper::CoreDims(b.start),
                           helper::CoreDims(b.count), true, true, reinterpret_cast<char *>(data),
                           vStart, vCount, true, true, static_cast<int>(variable.m_ElementSize),
                           helper::CoreDims(b.start), helper::CoreDims(b.count), vMemStart,
                           vMemCount);
        }
        else if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
        {
            std::memcpy(data, m_Buffer.data() + b.bufferStart, b.bufferCount);
        }
    }
}